

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vs_wrapper.hpp
# Opt level: O2

VSFrameRef *
VSInterface::GetFrame<MiniDeen>
          (int n,int activationReason,void **instanceData,void **frameData,VSFrameContext *frameCtx,
          VSCore *core,VSAPI *vsapi)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  pointer piVar4;
  mapped_type *pmVar5;
  VSFrameRef *pVVar6;
  int *i;
  pointer piVar7;
  _Hashtable<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  vector<int,_std::allocator<int>_> ref_frames;
  unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
  in_frames;
  int local_1d4;
  VSCore *local_1d0;
  _Vector_base<int,_std::allocator<int>_> local_1c8;
  long *local_1b0;
  _Hashtable<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1a8;
  DSFrame local_170;
  _Hashtable<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  _Hashtable<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  plVar1 = (long *)*instanceData;
  lVar2 = plVar1[0xc];
  if (lVar2 != 0) {
    *(VSFrameContext **)(lVar2 + 0x20) = frameCtx;
  }
  local_1c8._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d4 = n;
  local_1d0 = core;
  if (activationReason == 2) {
    local_1a8._M_buckets = &local_1a8._M_single_bucket;
    local_1a8._M_bucket_count = 1;
    local_1a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1a8._M_element_count = 0;
    local_1a8._M_rehash_policy._M_max_load_factor = 1.0;
    local_1a8._M_rehash_policy._M_next_resize = 0;
    local_1a8._M_single_bucket = (__node_base_ptr)0x0;
    local_1b0 = plVar1;
    if (lVar2 == 0) {
      DSFrame::DSFrame(&local_170,core,vsapi);
      pmVar5 = std::__detail::
               _Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_1a8,&local_1d4);
      DSFrame::operator=(pmVar5,&local_170);
      DSFrame::~DSFrame(&local_170);
    }
    else {
      (**(code **)(*plVar1 + 0x40))(&local_170,plVar1,n);
      std::vector<int,_std::allocator<int>_>::_M_move_assign
                ((vector<int,_std::allocator<int>_> *)&local_1c8,&local_170);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_170);
      piVar4 = local_1c8._M_impl.super__Vector_impl_data._M_finish;
      for (piVar7 = local_1c8._M_impl.super__Vector_impl_data._M_start; piVar7 != piVar4;
          piVar7 = piVar7 + 1) {
        pVVar6 = (*vsapi->getFrameFilter)(*piVar7,*(VSNodeRef **)(lVar2 + 8),frameCtx);
        DSFrame::DSFrame(&local_170,pVVar6,local_1d0,vsapi);
        pmVar5 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_1a8,piVar7);
        DSFrame::operator=(pmVar5,&local_170);
        DSFrame::~DSFrame(&local_170);
      }
    }
    iVar3 = local_1d4;
    std::
    _Hashtable<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable(&local_a0,&local_1a8);
    (**(code **)(*local_1b0 + 0x48))(&local_170,local_1b0,iVar3,&local_a0);
    if ((local_170._vsdst == (VSFrameRef *)0x0) &&
       (local_170._vsdst = local_170._vssrc, local_170._vssrc == (VSFrameRef *)0x0)) {
      pVVar6 = (VSFrameRef *)0x0;
    }
    else {
      pVVar6 = (*(local_170._vsapi)->cloneFrameRef)(local_170._vsdst);
    }
    DSFrame::~DSFrame(&local_170);
    this = &local_a0;
  }
  else {
    if (activationReason != 0) {
      pVVar6 = (VSFrameRef *)0x0;
      goto LAB_0010fa21;
    }
    if (lVar2 != 0) {
      (**(code **)(*plVar1 + 0x40))(&local_170,plVar1,n);
      std::vector<int,_std::allocator<int>_>::_M_move_assign
                ((vector<int,_std::allocator<int>_> *)&local_1c8,&local_170);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_170);
      piVar4 = local_1c8._M_impl.super__Vector_impl_data._M_finish;
      pVVar6 = (VSFrameRef *)0x0;
      for (piVar7 = local_1c8._M_impl.super__Vector_impl_data._M_start; piVar7 != piVar4;
          piVar7 = piVar7 + 1) {
        (*vsapi->requestFrameFilter)(*piVar7,*(VSNodeRef **)(lVar2 + 8),frameCtx);
      }
      goto LAB_0010fa21;
    }
    local_1a8._M_buckets = &local_1a8._M_single_bucket;
    local_1a8._M_bucket_count = 1;
    local_1a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1a8._M_element_count = 0;
    local_1a8._M_rehash_policy._M_max_load_factor = 1.0;
    local_1a8._M_rehash_policy._M_next_resize = 0;
    local_1a8._M_single_bucket = (__node_base_ptr)0x0;
    DSFrame::DSFrame(&local_170,core,vsapi);
    pmVar5 = std::__detail::
             _Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_1a8,&local_1d4);
    DSFrame::operator=(pmVar5,&local_170);
    DSFrame::~DSFrame(&local_170);
    iVar3 = local_1d4;
    std::
    _Hashtable<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable(&local_68,&local_1a8);
    (**(code **)(*plVar1 + 0x48))(&local_170,plVar1,iVar3,&local_68);
    if ((local_170._vsdst == (VSFrameRef *)0x0) &&
       (local_170._vsdst = local_170._vssrc, local_170._vssrc == (VSFrameRef *)0x0)) {
      pVVar6 = (VSFrameRef *)0x0;
    }
    else {
      pVVar6 = (*(local_170._vsapi)->cloneFrameRef)(local_170._vsdst);
    }
    DSFrame::~DSFrame(&local_170);
    this = &local_68;
  }
  std::
  _Hashtable<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(this);
  std::
  _Hashtable<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1a8);
LAB_0010fa21:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1c8);
  return pVVar6;
}

Assistant:

const VSFrameRef* VS_CC GetFrame(int n, int activationReason, void **instanceData, void **frameData, VSFrameContext *frameCtx, VSCore *core, const VSAPI *vsapi) {
    auto filter = reinterpret_cast<FilterType*>(*instanceData);
    auto functor = reinterpret_cast<VSFetchFrameFunctor*>(filter->fetch_frame);
    if (functor)
      functor->_frameCtx = frameCtx;

    std::vector<int> ref_frames;
    if (activationReason == VSActivationReason::arInitial) {
      if (functor) {
        ref_frames = filter->RequestReferenceFrames(n);
        for (auto &&i : ref_frames)
          vsapi->requestFrameFilter(i, functor->_vs_clip, frameCtx);
      }
      else {
        std::unordered_map<int, DSFrame> in_frames;
        in_frames[n] = DSFrame(core, vsapi);
        auto vs_frame = (filter->GetFrame(n, in_frames).ToVSFrame());
        return vs_frame;
      }
    }
    else if (activationReason == VSActivationReason::arAllFramesReady) {
      std::unordered_map<int, DSFrame> in_frames;
      if (functor) {
        ref_frames = filter->RequestReferenceFrames(n);
        for (auto &&i : ref_frames)
          in_frames[i] = DSFrame(vsapi->getFrameFilter(i, functor->_vs_clip, frameCtx), core, vsapi);
      }
      else
        in_frames[n] = DSFrame(core, vsapi);

      auto vs_frame = (filter->GetFrame(n, in_frames).ToVSFrame());
      return vs_frame;
    }
    return nullptr;
  }